

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*,char_const*>
          (ArgumentParser *this,char *Fargs,char *Fargs_1)

{
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__position;
  iterator argIt;
  uint __flags;
  __off64_t *in_R8;
  size_t in_R9;
  char *local_20;
  
  __flags = (uint)Fargs_1;
  __position = &this->mOptionalArguments;
  local_20 = Fargs;
  argIt = std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
          emplace<char_const*,char_const*>
                    ((list<argparse::Argument,std::allocator<argparse::Argument>> *)__position,
                     (const_iterator)__position,&local_20,(char **)&stack0xffffffffffffffd8);
  if (((ulong)argIt._M_node[0xc]._M_prev & 0x100000000) == 0) {
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (&this->mPositionalArguments,(int)&this->mPositionalArguments,(__off64_t *)__position,
               (int)argIt._M_node,in_R8,in_R9,__flags);
  }
  index_argument(this,(list_iterator)argIt._M_node);
  return (Argument *)(argIt._M_node + 1);
}

Assistant:

Argument &add_argument(Targs... Fargs) {
    auto tArgument = mOptionalArguments.emplace(cend(mOptionalArguments),
                                                std::move(Fargs)...);

    if (!tArgument->mIsOptional)
      mPositionalArguments.splice(cend(mPositionalArguments),
                                  mOptionalArguments, tArgument);

    index_argument(tArgument);
    return *tArgument;
  }